

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O3

shared_ptr<gui::MultilineTextBoxStyle> __thiscall
gui::MultilineTextBox::getStyle(MultilineTextBox *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  MultilineTextBoxStyle *pMVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_RSI;
  shared_ptr<gui::MultilineTextBoxStyle> sVar4;
  undefined1 local_29;
  MultilineTextBoxStyle *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if (*(char *)(in_RSI + 0x2d0) == '\0') {
    local_28 = (MultilineTextBoxStyle *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<gui::MultilineTextBoxStyle,std::allocator<gui::MultilineTextBoxStyle>,gui::MultilineTextBoxStyle_const&>
              (&_Stack_20,&local_28,(allocator<gui::MultilineTextBoxStyle> *)&local_29,
               *(MultilineTextBoxStyle **)(in_RSI + 0x2c0));
    _Var3._M_pi = _Stack_20._M_pi;
    pMVar2 = local_28;
    local_28 = (MultilineTextBoxStyle *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x2c8);
    *(MultilineTextBoxStyle **)(in_RSI + 0x2c0) = pMVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x2c8) = _Var3._M_pi;
    in_RDX._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX_00;
      if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
        in_RDX._M_pi = extraout_RDX_01;
      }
    }
    *(undefined1 *)(in_RSI + 0x2d0) = 1;
  }
  (this->super_Widget).super_Drawable._vptr_Drawable = *(_func_int ***)(in_RSI + 0x2c0);
  peVar1 = *(element_type **)(in_RSI + 0x2c8);
  (this->super_Widget).super_enable_shared_from_this<gui::Widget>._M_weak_this.
  super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  if (peVar1 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(peVar1->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
               super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar1->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
                    super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(peVar1->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
               super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(peVar1->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
                    super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  sVar4.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar4.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::MultilineTextBoxStyle>)
         sVar4.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MultilineTextBoxStyle> MultilineTextBox::getStyle() {
    if (!styleCopied_) {
        style_ = style_->clone();
        styleCopied_ = true;
    }
    return style_;
}